

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O1

void TransformWHT_C(int16_t *in,int16_t *out)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  long lVar9;
  int iVar14;
  int iVar15;
  undefined1 auVar10 [16];
  int iVar19;
  int iVar20;
  undefined1 auVar16 [16];
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar29;
  int iVar30;
  undefined1 auVar26 [16];
  int iVar34;
  int iVar35;
  undefined1 auVar31 [16];
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int tmp [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined2 uVar13;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  
  uVar1 = *(ulong *)in;
  uVar13 = (undefined2)(uVar1 >> 0x30);
  auVar12._8_4_ = 0;
  auVar12._0_8_ = uVar1;
  auVar12._12_2_ = uVar13;
  auVar12._14_2_ = uVar13;
  uVar13 = (undefined2)(uVar1 >> 0x20);
  auVar11._12_4_ = auVar12._12_4_;
  auVar11._8_2_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11._10_2_ = uVar13;
  auVar10._10_6_ = auVar11._10_6_;
  auVar10._8_2_ = uVar13;
  auVar10._0_8_ = uVar1;
  uVar13 = (undefined2)(uVar1 >> 0x10);
  auVar5._4_8_ = auVar10._8_8_;
  auVar5._2_2_ = uVar13;
  auVar5._0_2_ = uVar13;
  iVar14 = auVar5._0_4_ >> 0x10;
  iVar15 = auVar10._8_4_ >> 0x10;
  uVar2 = *(ulong *)(in + 0xc);
  uVar13 = (undefined2)(uVar2 >> 0x30);
  auVar18._8_4_ = 0;
  auVar18._0_8_ = uVar2;
  auVar18._12_2_ = uVar13;
  auVar18._14_2_ = uVar13;
  uVar13 = (undefined2)(uVar2 >> 0x20);
  auVar17._12_4_ = auVar18._12_4_;
  auVar17._8_2_ = 0;
  auVar17._0_8_ = uVar2;
  auVar17._10_2_ = uVar13;
  auVar16._10_6_ = auVar17._10_6_;
  auVar16._8_2_ = uVar13;
  auVar16._0_8_ = uVar2;
  uVar13 = (undefined2)(uVar2 >> 0x10);
  auVar6._4_8_ = auVar16._8_8_;
  auVar6._2_2_ = uVar13;
  auVar6._0_2_ = uVar13;
  iVar19 = auVar6._0_4_ >> 0x10;
  iVar20 = auVar16._8_4_ >> 0x10;
  iVar21 = (int)(short)uVar2 + (int)(short)uVar1;
  iVar22 = iVar19 + iVar14;
  iVar23 = iVar20 + iVar15;
  iVar24 = (auVar17._12_4_ >> 0x10) + (auVar11._12_4_ >> 0x10);
  uVar3 = *(ulong *)(in + 4);
  uVar13 = (undefined2)(uVar3 >> 0x30);
  auVar28._8_4_ = 0;
  auVar28._0_8_ = uVar3;
  auVar28._12_2_ = uVar13;
  auVar28._14_2_ = uVar13;
  uVar13 = (undefined2)(uVar3 >> 0x20);
  auVar27._12_4_ = auVar28._12_4_;
  auVar27._8_2_ = 0;
  auVar27._0_8_ = uVar3;
  auVar27._10_2_ = uVar13;
  auVar26._10_6_ = auVar27._10_6_;
  auVar26._8_2_ = uVar13;
  auVar26._0_8_ = uVar3;
  uVar13 = (undefined2)(uVar3 >> 0x10);
  auVar7._4_8_ = auVar26._8_8_;
  auVar7._2_2_ = uVar13;
  auVar7._0_2_ = uVar13;
  iVar29 = auVar7._0_4_ >> 0x10;
  iVar30 = auVar26._8_4_ >> 0x10;
  uVar4 = *(ulong *)(in + 8);
  uVar13 = (undefined2)(uVar4 >> 0x30);
  auVar33._8_4_ = 0;
  auVar33._0_8_ = uVar4;
  auVar33._12_2_ = uVar13;
  auVar33._14_2_ = uVar13;
  uVar13 = (undefined2)(uVar4 >> 0x20);
  auVar32._12_4_ = auVar33._12_4_;
  auVar32._8_2_ = 0;
  auVar32._0_8_ = uVar4;
  auVar32._10_2_ = uVar13;
  auVar31._10_6_ = auVar32._10_6_;
  auVar31._8_2_ = uVar13;
  auVar31._0_8_ = uVar4;
  uVar13 = (undefined2)(uVar4 >> 0x10);
  auVar8._4_8_ = auVar31._8_8_;
  auVar8._2_2_ = uVar13;
  auVar8._0_2_ = uVar13;
  iVar34 = auVar8._0_4_ >> 0x10;
  iVar35 = auVar31._8_4_ >> 0x10;
  iVar36 = (int)(short)uVar4 + (int)(short)uVar3;
  iVar37 = iVar34 + iVar29;
  iVar38 = iVar35 + iVar30;
  iVar39 = (auVar32._12_4_ >> 0x10) + (auVar27._12_4_ >> 0x10);
  iVar25 = (int)(short)uVar3 - (int)(short)uVar4;
  iVar29 = iVar29 - iVar34;
  iVar30 = iVar30 - iVar35;
  iVar35 = (auVar27._12_4_ >> 0x10) - (auVar32._12_4_ >> 0x10);
  iVar34 = (int)(short)uVar1 - (int)(short)uVar2;
  iVar14 = iVar14 - iVar19;
  iVar15 = iVar15 - iVar20;
  iVar19 = (auVar11._12_4_ >> 0x10) - (auVar17._12_4_ >> 0x10);
  tmp[0] = iVar36 + iVar21;
  tmp[1] = iVar37 + iVar22;
  tmp[2] = iVar38 + iVar23;
  tmp[3] = iVar39 + iVar24;
  tmp[8] = iVar21 - iVar36;
  tmp[9] = iVar22 - iVar37;
  tmp[10] = iVar23 - iVar38;
  tmp[0xb] = iVar24 - iVar39;
  tmp[4] = iVar25 + iVar34;
  tmp[5] = iVar29 + iVar14;
  tmp[6] = iVar30 + iVar15;
  tmp[7] = iVar35 + iVar19;
  tmp[0xc] = iVar34 - iVar25;
  tmp[0xd] = iVar14 - iVar29;
  tmp[0xe] = iVar15 - iVar30;
  tmp[0xf] = iVar19 - iVar35;
  lVar9 = 0;
  do {
    iVar14 = *(int *)((long)tmp + lVar9 + 4);
    iVar15 = *(int *)((long)tmp + lVar9 + 0xc);
    iVar20 = *(int *)((long)tmp + lVar9) + iVar15 + 3;
    iVar19 = *(int *)((long)tmp + lVar9 + 8);
    iVar34 = iVar19 + iVar14;
    iVar14 = iVar14 - iVar19;
    iVar15 = (*(int *)((long)tmp + lVar9) + 3) - iVar15;
    out[lVar9 * 4] = (int16_t)((uint)(iVar34 + iVar20) >> 3);
    out[lVar9 * 4 + 0x10] = (int16_t)((uint)(iVar14 + iVar15) >> 3);
    out[lVar9 * 4 + 0x20] = (int16_t)((uint)(iVar20 - iVar34) >> 3);
    out[lVar9 * 4 + 0x30] = (int16_t)((uint)(iVar15 - iVar14) >> 3);
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x40);
  return;
}

Assistant:

static void TransformWHT_C(const int16_t* WEBP_RESTRICT in,
                           int16_t* WEBP_RESTRICT out) {
  int tmp[16];
  int i;
  for (i = 0; i < 4; ++i) {
    const int a0 = in[0 + i] + in[12 + i];
    const int a1 = in[4 + i] + in[ 8 + i];
    const int a2 = in[4 + i] - in[ 8 + i];
    const int a3 = in[0 + i] - in[12 + i];
    tmp[0  + i] = a0 + a1;
    tmp[8  + i] = a0 - a1;
    tmp[4  + i] = a3 + a2;
    tmp[12 + i] = a3 - a2;
  }
  for (i = 0; i < 4; ++i) {
    const int dc = tmp[0 + i * 4] + 3;    // w/ rounder
    const int a0 = dc             + tmp[3 + i * 4];
    const int a1 = tmp[1 + i * 4] + tmp[2 + i * 4];
    const int a2 = tmp[1 + i * 4] - tmp[2 + i * 4];
    const int a3 = dc             - tmp[3 + i * 4];
    out[ 0] = (a0 + a1) >> 3;
    out[16] = (a3 + a2) >> 3;
    out[32] = (a0 - a1) >> 3;
    out[48] = (a3 - a2) >> 3;
    out += 64;
  }
}